

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

string * __thiscall
cmPolicies::GetPolicyWarning_abi_cxx11_(string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *pcVar1;
  char *local_38;
  char *local_30;
  char *local_28;
  
  pcVar1 = idToString((PolicyID)this);
  local_28 = pcVar1;
  local_30 = idToShortDescription((PolicyID)this);
  local_38 = pcVar1;
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[14],char_const*,char_const(&)[28],char_const*,char_const(&)[97]>
            (__return_storage_ptr__,(char (*) [8])"Policy ",&local_28,(char (*) [14])0x6862cd,
             &local_30,(char (*) [28])"  Run \"cmake --help-policy ",&local_38,
             (char (*) [97])
             "\" for policy details.  Use the cmake_policy command to set the policy and suppress this warning."
            );
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetPolicyWarning(cmPolicies::PolicyID id)
{
  return cmStrCat("Policy ", idToString(id),
                  " is not set: ", idToShortDescription(id),
                  "  "
                  "Run \"cmake --help-policy ",
                  idToString(id),
                  "\" for "
                  "policy details.  "
                  "Use the cmake_policy command to set the policy "
                  "and suppress this warning.");
}